

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationalBayesEstimatorOnLDA.cpp
# Opt level: O0

void __thiscall
VariationalBayesEstimatorOnLDA::initializeParam(VariationalBayesEstimatorOnLDA *this)

{
  double dVar1;
  uint uVar2;
  result_type rVar3;
  ulong uVar4;
  size_type sVar5;
  reference pvVar6;
  const_reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  iterator __first;
  iterator __last;
  result_type_conflict1 rVar10;
  double dVar11;
  pointer pdVar12;
  uint local_28e4;
  value_type_conflict1 vStack_28e0;
  int k_10;
  int local_28d8;
  int local_28d4;
  int v_1;
  int k_9;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_28c8;
  double local_28c0;
  double wordCount;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_28b0;
  int local_28a4;
  double dStack_28a0;
  int k_8;
  double Z;
  double randomValue_2;
  int v;
  int k_7;
  int local_287c;
  int local_2878;
  int k_6;
  int k_5;
  int d_7;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_2868;
  int local_2860;
  allocator<double> local_2859;
  int d_6;
  undefined1 local_2850 [8];
  vector<double,_std::allocator<double>_> ndkSum;
  double randomValue_1;
  int k_4;
  int d_5;
  int local_281c;
  const_iterator cStack_2818;
  int d_4;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_2810;
  uint local_2804;
  value_type_conflict1 vStack_2800;
  int d_3;
  uint local_27f4;
  iterator iStack_27f0;
  int k_3;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_27e8;
  double local_27e0;
  double qzSum;
  double randomValue;
  int k_2;
  int local_27b0;
  allocator<std::vector<double,_std::allocator<double>_>_> local_27a9;
  int l;
  int local_278c;
  undefined1 local_2788 [4];
  int d_2;
  uniform_real_distribution<double> randN;
  undefined1 local_2768 [8];
  mt19937 mt;
  random_device rnd;
  value_type_conflict1 local_50;
  int local_44;
  value_type_conflict1 vStack_40;
  int k_1;
  int local_34;
  value_type_conflict1 vStack_30;
  int d_1;
  int local_24;
  value_type_conflict1 vStack_20;
  int k;
  int local_14;
  VariationalBayesEstimatorOnLDA *pVStack_10;
  int d;
  VariationalBayesEstimatorOnLDA *this_local;
  
  local_14 = 0;
  pVStack_10 = this;
  while( true ) {
    uVar4 = (ulong)local_14;
    sVar5 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(&this->_thetaEx);
    if (sVar5 <= uVar4) break;
    pvVar6 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&this->_thetaEx,(long)local_14);
    vStack_20 = 0.0;
    std::vector<double,_std::allocator<double>_>::assign
              (pvVar6,(ulong)this->_K,&stack0xffffffffffffffe0);
    local_14 = local_14 + 1;
  }
  local_24 = 0;
  while( true ) {
    uVar4 = (ulong)local_24;
    sVar5 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(&this->_phiEx);
    if (sVar5 <= uVar4) break;
    pvVar6 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&this->_phiEx,(long)local_24);
    vStack_30 = 0.0;
    std::vector<double,_std::allocator<double>_>::assign
              (pvVar6,(ulong)this->_V,&stack0xffffffffffffffd0);
    local_24 = local_24 + 1;
  }
  local_34 = 0;
  while( true ) {
    uVar4 = (ulong)local_34;
    sVar5 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(&this->_ndk);
    if (sVar5 <= uVar4) break;
    pvVar6 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&this->_ndk,(long)local_34);
    vStack_40 = 0.0;
    std::vector<double,_std::allocator<double>_>::assign
              (pvVar6,(ulong)this->_K,&stack0xffffffffffffffc0);
    local_34 = local_34 + 1;
  }
  local_44 = 0;
  while( true ) {
    uVar4 = (ulong)local_44;
    sVar5 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(&this->_nkv);
    if (sVar5 <= uVar4) break;
    pvVar6 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&this->_nkv,(long)local_44);
    local_50 = 0.0;
    std::vector<double,_std::allocator<double>_>::assign(pvVar6,(ulong)this->_V,&local_50);
    local_44 = local_44 + 1;
  }
  rnd.field_0._M_mt._M_p = 0;
  std::vector<double,_std::allocator<double>_>::assign
            (&this->_nk,(ulong)this->_K,(value_type_conflict1 *)&rnd.field_0._M_mt._M_p);
  std::random_device::random_device((random_device *)&mt._M_p);
  rVar3 = std::random_device::operator()((random_device *)&mt._M_p);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)local_2768,(ulong)rVar3);
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)local_2788,0.0,1.0);
  local_278c = 0;
  while( true ) {
    uVar4 = (ulong)local_278c;
    sVar5 = std::
            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::size(this->_docVoca);
    if (sVar5 <= uVar4) break;
    pvVar7 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator[](this->_docVoca,(long)local_278c);
    sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar7);
    std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator(&local_27a9);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)&l,sVar5,&local_27a9);
    pvVar8 = std::
             vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
             ::operator[](&this->_qz,(long)local_278c);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::operator=(pvVar8,(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        *)&l);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)&l);
    std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator(&local_27a9);
    local_27b0 = 0;
    while( true ) {
      uVar4 = (ulong)local_27b0;
      pvVar7 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](this->_docVoca,(long)local_278c);
      sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar7);
      if (sVar5 <= uVar4) break;
      uVar2 = this->_K;
      std::allocator<double>::allocator((allocator<double> *)((long)&randomValue + 7));
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&k_2,(ulong)uVar2,
                 (allocator<double> *)((long)&randomValue + 7));
      pvVar8 = std::
               vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ::operator[](&this->_qz,(long)local_278c);
      pvVar6 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](pvVar8,(long)local_27b0);
      std::vector<double,_std::allocator<double>_>::operator=
                (pvVar6,(vector<double,_std::allocator<double>_> *)&k_2);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)&k_2);
      std::allocator<double>::~allocator((allocator<double> *)((long)&randomValue + 7));
      for (randomValue._0_4_ = 0; randomValue._0_4_ < this->_K;
          randomValue._0_4_ = randomValue._0_4_ + 1) {
        rVar10 = std::uniform_real_distribution<double>::operator()
                           ((uniform_real_distribution<double> *)local_2788,
                            (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                             *)local_2768);
        qzSum = rVar10;
        pvVar8 = std::
                 vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 ::operator[](&this->_qz,(long)local_278c);
        pvVar6 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](pvVar8,(long)local_27b0);
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                           (pvVar6,(long)(int)randomValue._0_4_);
        *pvVar9 = rVar10;
      }
      pvVar8 = std::
               vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ::operator[](&this->_qz,(long)local_278c);
      pvVar6 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](pvVar8,(long)local_27b0);
      local_27e8._M_current = (double *)std::vector<double,_std::allocator<double>_>::begin(pvVar6);
      pvVar8 = std::
               vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ::operator[](&this->_qz,(long)local_278c);
      pvVar6 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](pvVar8,(long)local_27b0);
      iStack_27f0 = std::vector<double,_std::allocator<double>_>::end(pvVar6);
      local_27e0 = std::
                   accumulate<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                             (local_27e8,
                              (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                               )iStack_27f0._M_current,0.0);
      for (local_27f4 = 0; dVar11 = local_27e0, local_27f4 < this->_K; local_27f4 = local_27f4 + 1)
      {
        pvVar8 = std::
                 vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 ::operator[](&this->_qz,(long)local_278c);
        pvVar6 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](pvVar8,(long)local_27b0);
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                           (pvVar6,(long)(int)local_27f4);
        *pvVar9 = *pvVar9 / dVar11;
      }
      local_27b0 = local_27b0 + 1;
    }
    local_278c = local_278c + 1;
  }
  vStack_2800 = 0.0;
  std::vector<double,_std::allocator<double>_>::assign
            (&this->_nd,(ulong)this->_D,&stack0xffffffffffffd800);
  for (local_2804 = 0; local_2804 < this->_D; local_2804 = local_2804 + 1) {
    pvVar7 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator[](this->_frequencyMatrix,(long)(int)local_2804);
    local_2810._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar7);
    pvVar7 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator[](this->_frequencyMatrix,(long)(int)local_2804);
    cStack_2818 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar7);
    dVar11 = std::
             accumulate<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,double>
                       (local_2810,
                        (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                         )cStack_2818._M_current,0.0);
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->_nd,(long)(int)local_2804);
    *pvVar9 = dVar11;
  }
  local_281c = 0;
  while( true ) {
    uVar4 = (ulong)local_281c;
    sVar5 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(&this->_ndk);
    if (sVar5 <= uVar4) break;
    pvVar6 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&this->_ndk,(long)local_281c);
    _k_4 = 0.0;
    std::vector<double,_std::allocator<double>_>::assign
              (pvVar6,(ulong)this->_K,(value_type_conflict1 *)&k_4);
    local_281c = local_281c + 1;
  }
  randomValue_1._4_4_ = 0;
  while( true ) {
    sVar5 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(&this->_ndk);
    if (sVar5 <= (ulong)(long)randomValue_1._4_4_) break;
    randomValue_1._0_4_ = 0;
    while( true ) {
      pvVar6 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->_ndk,(long)randomValue_1._4_4_);
      sVar5 = std::vector<double,_std::allocator<double>_>::size(pvVar6);
      if (sVar5 <= (ulong)(long)randomValue_1._0_4_) break;
      pdVar12 = (pointer)std::uniform_real_distribution<double>::operator()
                                   ((uniform_real_distribution<double> *)local_2788,
                                    (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                                     *)local_2768);
      ndkSum.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pdVar12;
      pvVar6 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->_ndk,(long)randomValue_1._4_4_);
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                         (pvVar6,(long)randomValue_1._0_4_);
      *pvVar9 = (value_type)pdVar12;
      randomValue_1._0_4_ = randomValue_1._0_4_ + 1;
    }
    randomValue_1._4_4_ = randomValue_1._4_4_ + 1;
  }
  uVar2 = this->_D;
  _d_6 = 0.0;
  std::allocator<double>::allocator(&local_2859);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_2850,(ulong)uVar2,
             (value_type_conflict1 *)&d_6,&local_2859);
  std::allocator<double>::~allocator(&local_2859);
  local_2860 = 0;
  while( true ) {
    uVar4 = (ulong)local_2860;
    sVar5 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(&this->_ndk);
    if (sVar5 <= uVar4) break;
    pvVar6 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&this->_ndk,(long)local_2860);
    local_2868._M_current = (double *)std::vector<double,_std::allocator<double>_>::begin(pvVar6);
    pvVar6 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&this->_ndk,(long)local_2860);
    _k_5 = std::vector<double,_std::allocator<double>_>::end(pvVar6);
    dVar11 = std::
             accumulate<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                       (local_2868,
                        (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                        _k_5,0.0);
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_2850,(long)local_2860);
    *pvVar9 = dVar11;
    local_2860 = local_2860 + 1;
  }
  k_6 = 0;
  while( true ) {
    uVar4 = (ulong)k_6;
    sVar5 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(&this->_ndk);
    if (sVar5 <= uVar4) break;
    local_2878 = 0;
    while( true ) {
      uVar4 = (ulong)local_2878;
      pvVar6 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->_ndk,(long)k_6);
      sVar5 = std::vector<double,_std::allocator<double>_>::size(pvVar6);
      if (sVar5 <= uVar4) break;
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_2850,(long)k_6);
      dVar11 = *pvVar9;
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](&this->_nd,(long)k_6);
      dVar1 = *pvVar9;
      pvVar6 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->_ndk,(long)k_6);
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,(long)local_2878);
      *pvVar9 = *pvVar9 / (dVar11 / dVar1);
      local_2878 = local_2878 + 1;
    }
    k_6 = k_6 + 1;
  }
  local_287c = 0;
  while( true ) {
    uVar4 = (ulong)local_287c;
    sVar5 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(&this->_nkv);
    if (sVar5 <= uVar4) break;
    pvVar6 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&this->_nkv,(long)local_287c);
    _v = 0.0;
    std::vector<double,_std::allocator<double>_>::assign
              (pvVar6,(ulong)this->_V,(value_type_conflict1 *)&v);
    local_287c = local_287c + 1;
  }
  randomValue_2._4_4_ = 0;
  while( true ) {
    uVar4 = (ulong)randomValue_2._4_4_;
    sVar5 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(&this->_nkv);
    if (sVar5 <= uVar4) break;
    randomValue_2._0_4_ = 0;
    while( true ) {
      uVar4 = (ulong)randomValue_2._0_4_;
      pvVar6 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->_nkv,(long)randomValue_2._4_4_);
      sVar5 = std::vector<double,_std::allocator<double>_>::size(pvVar6);
      if (sVar5 <= uVar4) break;
      rVar10 = std::uniform_real_distribution<double>::operator()
                         ((uniform_real_distribution<double> *)local_2788,
                          (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                           *)local_2768);
      Z = rVar10;
      pvVar6 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->_nkv,(long)randomValue_2._4_4_);
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                         (pvVar6,(long)randomValue_2._0_4_);
      *pvVar9 = rVar10;
      randomValue_2._0_4_ = randomValue_2._0_4_ + 1;
    }
    randomValue_2._4_4_ = randomValue_2._4_4_ + 1;
  }
  dStack_28a0 = 0.0;
  local_28a4 = 0;
  while( true ) {
    uVar4 = (ulong)local_28a4;
    sVar5 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(&this->_nkv);
    if (sVar5 <= uVar4) break;
    pvVar6 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&this->_nkv,(long)local_28a4);
    local_28b0._M_current = (double *)std::vector<double,_std::allocator<double>_>::begin(pvVar6);
    pvVar6 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&this->_nkv,(long)local_28a4);
    wordCount = (double)std::vector<double,_std::allocator<double>_>::end(pvVar6);
    dVar11 = std::
             accumulate<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                       (local_28b0,
                        (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                        wordCount,0.0);
    dStack_28a0 = dVar11 + dStack_28a0;
    local_28a4 = local_28a4 + 1;
  }
  local_28c8._M_current = (double *)std::vector<double,_std::allocator<double>_>::begin(&this->_nd);
  _v_1 = std::vector<double,_std::allocator<double>_>::end(&this->_nd);
  local_28c0 = std::
               accumulate<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                         (local_28c8,
                          (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                           )_v_1,0.0);
  local_28d4 = 0;
  while( true ) {
    uVar4 = (ulong)local_28d4;
    sVar5 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(&this->_nkv);
    if (sVar5 <= uVar4) break;
    local_28d8 = 0;
    while( true ) {
      uVar4 = (ulong)local_28d8;
      pvVar6 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->_nkv,(long)local_28d4);
      sVar5 = std::vector<double,_std::allocator<double>_>::size(pvVar6);
      if (sVar5 <= uVar4) break;
      dVar11 = dStack_28a0 / local_28c0;
      pvVar6 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->_nkv,(long)local_28d4);
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,(long)local_28d8);
      *pvVar9 = *pvVar9 / dVar11;
      local_28d8 = local_28d8 + 1;
    }
    local_28d4 = local_28d4 + 1;
  }
  vStack_28e0 = 0.0;
  std::vector<double,_std::allocator<double>_>::assign
            (&this->_nk,(ulong)this->_K,&stack0xffffffffffffd720);
  for (local_28e4 = 0; local_28e4 < this->_K; local_28e4 = local_28e4 + 1) {
    pvVar6 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&this->_nkv,(long)(int)local_28e4);
    __first = std::vector<double,_std::allocator<double>_>::begin(pvVar6);
    pvVar6 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&this->_nkv,(long)(int)local_28e4);
    __last = std::vector<double,_std::allocator<double>_>::end(pvVar6);
    dVar11 = std::
             accumulate<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                       ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                        __first._M_current,
                        (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                        __last._M_current,0.0);
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->_nk,(long)(int)local_28e4);
    *pvVar9 = dVar11;
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_2850);
  std::random_device::~random_device((random_device *)&mt._M_p);
  return;
}

Assistant:

void VariationalBayesEstimatorOnLDA::initializeParam(){//{{{
    for(int d=0; d<_thetaEx.size(); d++)_thetaEx[d].assign(_K, 0);
    for(int k=0; k<_phiEx.size(); k++)_phiEx[k].assign(_V, 0);
    for(int d=0; d<_ndk.size(); d++)_ndk[d].assign(_K, 0);
    for(int k=0; k<_nkv.size(); k++)_nkv[k].assign(_V, 0);
    _nk.assign(_K, 0);

    random_device rnd;
    mt19937 mt(rnd());
    uniform_real_distribution<double> randN(0, 1);
    for(int d=0; d<_docVoca.size(); d++){
        _qz[d] = vector<vector<double> >(_docVoca[d].size());
        for(int l=0; l<_docVoca[d].size(); l++){
            _qz[d][l] = vector<double>(_K);
            for(int k=0; k<_K; k++){
                double randomValue = randN(mt);
                _qz[d][l][k] = randomValue;
            }
            double qzSum = accumulate(_qz[d][l].begin(), _qz[d][l].end(), 0.0);
            for(int k=0; k<_K; k++){
                _qz[d][l][k] /= qzSum;
            }
        }
    }

    _nd.assign(_D, 0);
    for(int d=0;d<_D;d++){
        _nd[d] = accumulate(_frequencyMatrix[d].begin(), _frequencyMatrix[d].end(), 0.0);
    }

    for(int d=0;d<_ndk.size();d++)_ndk[d].assign(_K, 0);
    for(int d=0;d<_ndk.size();d++){
        for(int k=0;k<_ndk[d].size();k++){
            double randomValue=randN(mt);
            _ndk[d][k] = randomValue;
        }
    }
    vector<double> ndkSum(_D, 0);
    for(int d=0;d<_ndk.size();d++){
        ndkSum[d] = accumulate(_ndk[d].begin(), _ndk[d].end(), 0.0);
    }
    for(int d=0;d<_ndk.size();d++){
        for(int k=0;k<_ndk[d].size();k++){
            _ndk[d][k] /= ndkSum[d]/_nd[d];
        }
    }

    for(int k=0;k<_nkv.size();k++)_nkv[k].assign(_V, 0);
    for(int k=0;k<_nkv.size();k++){
        for(int v=0;v<_nkv[k].size();v++){
            double randomValue=randN(mt);
            _nkv[k][v] = randomValue;
        }
    }
    double Z = 0;
    for(int k=0;k<_nkv.size();k++){
        Z += accumulate(_nkv[k].begin(), _nkv[k].end(), 0.0);
    }
    double wordCount = accumulate(_nd.begin(), _nd.end(), 0.0);
    for(int k=0;k<_nkv.size();k++){
        for(int v=0;v<_nkv[k].size();v++){
            _nkv[k][v] /= Z/wordCount;
        }
    }

    _nk.assign(_K, 0);
    for(int k=0;k<_K;k++){
        _nk[k] = accumulate(_nkv[k].begin(), _nkv[k].end(), 0.0);
    }

}